

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashSet.hpp
# Opt level: O1

Iterator __thiscall HashSet<String>::insert(HashSet<String> *this,Iterator *position,String *key)

{
  Item **ppIVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  Item *pIVar5;
  Iterator this_00;
  void *buffer;
  undefined8 *puVar6;
  char *pcVar7;
  ulong uVar8;
  Item *pIVar9;
  HashSet<String> *pHVar10;
  long lVar11;
  long lVar12;
  
  this_00 = find(this,key);
  if (this_00.item == *(Item **)this) {
    if (*(long *)(this + 0x20) == 0) {
      lVar12 = *(long *)(this + 0x18);
      buffer = operator_new__(lVar12 << 3);
      *(void **)(this + 0x20) = buffer;
      Memory::zero(buffer,lVar12 << 3);
    }
    this_00.item = *(Item **)(this + 0x70);
    if (this_00.item == (Item *)0x0) {
      puVar6 = (undefined8 *)operator_new__(0x128);
      *puVar6 = *(undefined8 *)(this + 0x78);
      *(undefined8 **)(this + 0x78) = puVar6;
      lVar12 = *(long *)(this + 0x70);
      lVar11 = 0x50;
      uVar8 = 8;
      do {
        *(long *)((long)puVar6 + lVar11 + 0x38) = lVar12;
        lVar12 = (long)puVar6 + lVar11;
        lVar11 = lVar11 + 0x48;
        uVar8 = uVar8 + 0x48;
      } while (uVar8 < 0xe0);
      this_00.item = (Item *)(puVar6 + 1);
      pIVar9 = (Item *)(uVar8 + (long)puVar6);
    }
    else {
      pIVar9 = (this_00.item)->prev;
    }
    *(Item **)(this + 0x70) = pIVar9;
    uVar8 = key->data->len;
    pcVar7 = String::operator_cast_to_char_(key);
    cVar2 = *pcVar7;
    cVar3 = pcVar7[uVar8 >> 1];
    cVar4 = pcVar7[(ulong)(uVar8 == 0) + (uVar8 - 1)];
    String::String(&(this_00.item)->key,key);
    ppIVar1 = (Item **)(*(long *)(this + 0x20) +
                       (((long)cVar4 ^
                        ((long)cVar3 ^ ((long)cVar2 ^ uVar8 * 0x41a7) * 0x41a7) * 0x41a7) %
                       *(ulong *)(this + 0x18)) * 8);
    (this_00.item)->cell = ppIVar1;
    pIVar9 = *ppIVar1;
    (this_00.item)->nextCell = pIVar9;
    if (pIVar9 != (Item *)0x0) {
      pIVar9->cell = &(this_00.item)->nextCell;
    }
    *ppIVar1 = this_00.item;
    pIVar9 = position->item;
    pIVar5 = pIVar9->prev;
    (this_00.item)->prev = pIVar5;
    if (pIVar5 == (Item *)0x0) {
      pHVar10 = this + 8;
    }
    else {
      pHVar10 = (HashSet<String> *)&pIVar9->prev->next;
    }
    *(Item **)pHVar10 = this_00.item;
    (this_00.item)->next = pIVar9;
    pIVar9->prev = this_00.item;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  return (Iterator)this_00.item;
}

Assistant:

Iterator insert(const Iterator& position, const T& key)
  {
    Iterator it = find(key);
    if (it != _end) return it;

    if (!data)
    {
      data = (Item**)new char[sizeof(Item*) * capacity];
      Memory::zero(data, sizeof(Item*)* capacity);
    }

    Item* item;
    if (freeItem)
    {
      item = freeItem;
      freeItem = freeItem->prev;
    }
    else
    {
      ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + sizeof(Item) * 4];
      itemBlock->next = blocks;
      blocks = itemBlock;
      item = (Item*)((char*)itemBlock + sizeof(ItemBlock));

      for (Item* i = item + 1, *end = item + 4; i < end; ++i)
      {
        i->prev = freeItem;
        freeItem = i;
      }
    }

    usize hashCode = hash(key);
#ifdef VERIFY
    VERIFY(new(item)Item(key) == item);
#else
    new(item)Item(key);
#endif

    Item** cell;
    item->cell = (cell = &data[hashCode % capacity]);
    if((item->nextCell = *cell))
      item->nextCell->cell = &item->nextCell;
    *cell = item;

    Item* insertPos = position.item;
    if ((item->prev = insertPos->prev))
      insertPos->prev->next = item;
    else
      _begin.item = item;

    item->next = insertPos;
    insertPos->prev = item;
    ++_size;
    return item;
  }